

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateSharedHandleNoDestroy
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handleData)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  size_type __n;
  int iVar3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string type;
  string aliasHandle;
  allocator_type local_202;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  long *local_1e0;
  size_type local_1d8;
  long local_1d0 [2];
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  if ((handleData->second).deleteCommand._M_string_length == 0) {
    paVar7 = &local_150.first.field_2;
    local_150.first._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Vk","");
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    pcVar2 = (handleData->first)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,pcVar2,pcVar2 + (handleData->first)._M_string_length);
    _Var6._M_p = local_150.first._M_dataplus._M_p;
    if ((local_150.first._M_string_length <= local_1a0._M_string_length) &&
       ((local_150.first._M_string_length == 0 ||
        (iVar3 = bcmp(local_1a0._M_dataplus._M_p,local_150.first._M_dataplus._M_p,
                      local_150.first._M_string_length), iVar3 == 0)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_1a0,0,local_150.first._M_string_length);
      _Var6._M_p = local_150.first._M_dataplus._M_p;
    }
    local_180 = __return_storage_ptr__;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar7) {
      operator_delete(_Var6._M_p,local_150.first.field_2._M_allocated_capacity + 1);
    }
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    p_Var4 = (handleData->second).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(handleData->second).aliases._M_t._M_impl.super__Rb_tree_header;
    local_158 = handleData;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        if ((generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
             ::aliasHandleTemplate_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                                         ::aliasHandleTemplate_abi_cxx11_), iVar3 != 0)) {
          generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
          ::aliasHandleTemplate_abi_cxx11_._M_dataplus._M_p =
               (pointer)&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                         ::aliasHandleTemplate_abi_cxx11_.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                      ::aliasHandleTemplate_abi_cxx11_,
                     "  using Shared${aliasType} = SharedHandle<${type}>;","");
          __cxa_atexit(std::__cxx11::string::~string,
                       &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                        ::aliasHandleTemplate_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                               ::aliasHandleTemplate_abi_cxx11_);
        }
        local_1e0 = local_1d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"Vk","");
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,*(long *)(p_Var4 + 1),
                   (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
        __n = local_1d8;
        if ((local_1d8 <= local_200._M_string_length) &&
           ((local_1d8 == 0 ||
            (iVar3 = bcmp(local_200._M_dataplus._M_p,local_1e0,local_1d8), iVar3 == 0)))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (&local_200,0,__n);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_150,(char (*) [10])"aliasType",&local_200);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_110,(char (*) [5])0x22242f,&local_1a0);
        __l._M_len = 2;
        __l._M_array = &local_150;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_60,__l,&local_201,&local_202);
        replaceWithMap(&local_1c0,
                       &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                        ::aliasHandleTemplate_abi_cxx11_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_60);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_178,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
        lVar8 = -0x80;
        paVar7 = &local_110.second.field_2;
        do {
          if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar7->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                            paVar7->_M_allocated_capacity + 1);
          }
          if (&paVar7->_M_allocated_capacity + -4 !=
              (size_type *)(&paVar7->_M_allocated_capacity)[-6]) {
            operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                            (&paVar7->_M_allocated_capacity)[-4] + 1);
          }
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(&paVar7->_M_allocated_capacity + -8);
          lVar8 = lVar8 + 0x40;
        } while (lVar8 != 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    if ((generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
         ::sharedHandleTemplate_abi_cxx11_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                                     ::sharedHandleTemplate_abi_cxx11_), iVar3 != 0)) {
      generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
      ::sharedHandleTemplate_abi_cxx11_._M_dataplus._M_p =
           (pointer)&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                     ::sharedHandleTemplate_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                  ::sharedHandleTemplate_abi_cxx11_,
                 "\ntemplate <>\nclass SharedHandle<${type}> : public SharedHandleBaseNoDestroy<${type}, ${parent}>\n{\n  friend SharedHandleBase<${type}, ${parent}>;\n\npublic:\n  SharedHandle() = default;\n  explicit SharedHandle(${type} handle, ${parent} parent) noexcept\n    : SharedHandleBaseNoDestroy<${type}, ${parent}>(handle, std::move(parent))\n  {}\n};\nusing Shared${type} = SharedHandle<${type}>;\n${aliasHandle}"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                    ::sharedHandleTemplate_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                           ::sharedHandleTemplate_abi_cxx11_);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_150,(char (*) [12])"aliasHandle",&local_178);
    local_1e0 = local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"Vk","");
    pcVar2 = (local_158->second).parent._M_dataplus._M_p;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,pcVar2,pcVar2 + (local_158->second).parent._M_string_length);
    if ((local_1d8 <= local_200._M_string_length) &&
       ((local_1d8 == 0 ||
        (iVar3 = bcmp(local_200._M_dataplus._M_p,local_1e0,local_1d8), iVar3 == 0)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_200,0,local_1d8);
    }
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_200,0,0,"Shared",6);
    local_1c0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar7 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == paVar7) {
      local_1c0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_1c0._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_110,(char (*) [7])"parent",&local_1c0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_d0,(char (*) [5])0x22242f,&local_1a0);
    __l_00._M_len = 3;
    __l_00._M_array = &local_150;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_90,__l_00,&local_201,&local_202);
    replaceWithMap(local_180,
                   &generateSharedHandleNoDestroy(std::pair<std::__cxx11::string,VulkanHppGenerator::HandleData>const&)
                    ::sharedHandleTemplate_abi_cxx11_,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    lVar8 = -0xc0;
    paVar7 = &local_d0.second.field_2;
    do {
      if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar7->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                        paVar7->_M_allocated_capacity + 1);
      }
      if (&paVar7->_M_allocated_capacity + -4 != (size_type *)(&paVar7->_M_allocated_capacity)[-6])
      {
        operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                        (&paVar7->_M_allocated_capacity)[-4] + 1);
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar7->_M_allocated_capacity + -8);
      lVar8 = lVar8 + 0x40;
    } while (lVar8 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ = local_180;
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                               local_178.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateSharedHandleNoDestroy( std::pair<std::string, HandleData> const & handleData ) const
{
  if ( handleData.second.deleteCommand.empty() )
  {
    std::string type = stripPrefix( handleData.first, "Vk" );
    std::string aliasHandle;
    for ( auto const & alias : handleData.second.aliases )
    {
      static const std::string aliasHandleTemplate = R"(  using Shared${aliasType} = SharedHandle<${type}>;)";

      aliasHandle += replaceWithMap( aliasHandleTemplate, { { "aliasType", stripPrefix( alias.first, "Vk" ) }, { "type", type } } );
    }

    static const std::string sharedHandleTemplate = R"(
template <>
class SharedHandle<${type}> : public SharedHandleBaseNoDestroy<${type}, ${parent}>
{
  friend SharedHandleBase<${type}, ${parent}>;

public:
  SharedHandle() = default;
  explicit SharedHandle(${type} handle, ${parent} parent) noexcept
    : SharedHandleBaseNoDestroy<${type}, ${parent}>(handle, std::move(parent))
  {}
};
using Shared${type} = SharedHandle<${type}>;
${aliasHandle})";

    return replaceWithMap( sharedHandleTemplate,
                           { { "aliasHandle", aliasHandle }, { "parent", "Shared" + stripPrefix( handleData.second.parent, "Vk" ) }, { "type", type } } );
  }
  return "";
}